

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>::
emplaceRealloc<slang::analysis::ClockInference::ExpansionInstance>
          (SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance> *this,pointer pos,
          ExpansionInstance *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pEVar4;
  long lVar5;
  pointer pEVar6;
  pointer pEVar7;
  iterator __result;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  ExpansionInstance *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance> *)0x82d2db);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pEVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pEVar4;
  pEVar6 = (pointer)operator_new(0x82d33d);
  pEVar7 = pEVar6 + lVar5 / 0x18;
  pEVar7->expr = (AssertionInstanceExpression *)*in_RDX;
  pEVar7->clock = (TimingControl *)in_RDX[1];
  *(undefined8 *)&pEVar7->hasInferredClockArg = in_RDX[2];
  pEVar4 = end(in_RDI);
  if (in_RSI == pEVar4) {
    __result = begin(in_RDI);
    pEVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::analysis::ClockInference::ExpansionInstance*,slang::analysis::ClockInference::ExpansionInstance*>
              (in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::analysis::ClockInference::ExpansionInstance*,slang::analysis::ClockInference::ExpansionInstance*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pEVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::analysis::ClockInference::ExpansionInstance*,slang::analysis::ClockInference::ExpansionInstance*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pEVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pEVar6;
  return pEVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}